

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O0

void __thiscall
Catch::SonarQubeReporter::writeAssertion
          (SonarQubeReporter *this,AssertionStats *stats,bool okToFail)

{
  bool bVar1;
  OfType OVar2;
  ReusableStringStream *pRVar3;
  string local_1e0;
  StringRef local_1c0;
  SourceLineInfo local_1b0;
  char local_199;
  reference local_198;
  MessageInfo *msg;
  const_iterator __end2;
  const_iterator __begin2;
  vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *__range2;
  StringRef local_170;
  char local_159;
  string local_158;
  char local_131;
  string local_130;
  char local_109;
  undefined1 local_108 [8];
  ReusableStringStream textRss;
  StringRef local_d8;
  StringRef local_c8;
  char local_b1;
  string local_b0;
  char local_89;
  StringRef local_88;
  undefined1 local_78 [8];
  ReusableStringStream messageRss;
  ScopedElement e;
  string local_48 [8];
  string elementName;
  AssertionResult *result;
  bool okToFail_local;
  AssertionStats *stats_local;
  SonarQubeReporter *this_local;
  
  elementName.field_2._8_8_ = stats;
  bVar1 = AssertionResult::isOk(&stats->assertionResult);
  if ((bVar1) &&
     (OVar2 = AssertionResult::getResultType((AssertionResult *)elementName.field_2._8_8_),
     OVar2 != ExplicitSkip)) {
    return;
  }
  std::__cxx11::string::string(local_48);
  if (okToFail) {
    std::__cxx11::string::operator=(local_48,"skipped");
    goto LAB_00150f65;
  }
  OVar2 = AssertionResult::getResultType((AssertionResult *)elementName.field_2._8_8_);
  if (3 < (uint)(OVar2 + Info)) {
    if (OVar2 == ExplicitSkip) {
      std::__cxx11::string::operator=(local_48,"skipped");
      goto LAB_00150f65;
    }
    if (OVar2 != FailureBit) {
      if ((uint)(OVar2 + ~FailureBit) < 2) {
LAB_00150f27:
        std::__cxx11::string::operator=(local_48,"failure");
        goto LAB_00150f65;
      }
      if (OVar2 != Exception) {
        if (OVar2 != ThrewException) {
          if (OVar2 == DidntThrowException) goto LAB_00150f27;
          if (OVar2 != FatalErrorCondition) goto LAB_00150f65;
        }
        std::__cxx11::string::operator=(local_48,"error");
        goto LAB_00150f65;
      }
    }
  }
  std::__cxx11::string::operator=(local_48,"internalError");
LAB_00150f65:
  operator|(Newline,Indent);
  XmlWriter::scopedElement
            ((XmlWriter *)&messageRss.m_oss,(string *)&this->xml,(XmlFormatting)local_48);
  ReusableStringStream::ReusableStringStream((ReusableStringStream *)local_78);
  local_88 = AssertionResult::getTestMacroName((AssertionResult *)elementName.field_2._8_8_);
  pRVar3 = ReusableStringStream::operator<<((ReusableStringStream *)local_78,&local_88);
  local_89 = '(';
  pRVar3 = ReusableStringStream::operator<<(pRVar3,&local_89);
  AssertionResult::getExpression_abi_cxx11_(&local_b0,(AssertionResult *)elementName.field_2._8_8_);
  pRVar3 = ReusableStringStream::operator<<(pRVar3,&local_b0);
  local_b1 = ')';
  ReusableStringStream::operator<<(pRVar3,&local_b1);
  std::__cxx11::string::~string((string *)&local_b0);
  local_c8 = operator____sr("message",7);
  ReusableStringStream::str_abi_cxx11_((string *)&textRss.m_oss,(ReusableStringStream *)local_78);
  StringRef::StringRef(&local_d8,(string *)&textRss.m_oss);
  XmlWriter::writeAttribute(&this->xml,local_c8,local_d8);
  std::__cxx11::string::~string((string *)&textRss.m_oss);
  ReusableStringStream::ReusableStringStream((ReusableStringStream *)local_108);
  OVar2 = AssertionResult::getResultType((AssertionResult *)elementName.field_2._8_8_);
  if (OVar2 == ExplicitSkip) {
    ReusableStringStream::operator<<((ReusableStringStream *)local_108,(char (*) [9])"SKIPPED\n");
  }
  else {
    ReusableStringStream::operator<<((ReusableStringStream *)local_108,(char (*) [9])"FAILED:\n");
    bVar1 = AssertionResult::hasExpression((AssertionResult *)elementName.field_2._8_8_);
    if (bVar1) {
      local_109 = '\t';
      pRVar3 = ReusableStringStream::operator<<((ReusableStringStream *)local_108,&local_109);
      AssertionResult::getExpressionInMacro_abi_cxx11_
                (&local_130,(AssertionResult *)elementName.field_2._8_8_);
      pRVar3 = ReusableStringStream::operator<<(pRVar3,&local_130);
      local_131 = '\n';
      ReusableStringStream::operator<<(pRVar3,&local_131);
      std::__cxx11::string::~string((string *)&local_130);
    }
    bVar1 = AssertionResult::hasExpandedExpression((AssertionResult *)elementName.field_2._8_8_);
    if (bVar1) {
      pRVar3 = ReusableStringStream::operator<<
                         ((ReusableStringStream *)local_108,(char (*) [18])"with expansion:\n\t");
      AssertionResult::getExpandedExpression_abi_cxx11_
                (&local_158,(AssertionResult *)elementName.field_2._8_8_);
      pRVar3 = ReusableStringStream::operator<<(pRVar3,&local_158);
      local_159 = '\n';
      ReusableStringStream::operator<<(pRVar3,&local_159);
      std::__cxx11::string::~string((string *)&local_158);
    }
  }
  bVar1 = AssertionResult::hasMessage((AssertionResult *)elementName.field_2._8_8_);
  if (bVar1) {
    local_170 = AssertionResult::getMessage((AssertionResult *)elementName.field_2._8_8_);
    pRVar3 = ReusableStringStream::operator<<((ReusableStringStream *)local_108,&local_170);
    __range2._7_1_ = 10;
    ReusableStringStream::operator<<(pRVar3,(char *)((long)&__range2 + 7));
  }
  __end2 = std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::begin
                     (&stats->infoMessages);
  msg = (MessageInfo *)
        std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::end
                  (&stats->infoMessages);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                                     *)&msg), bVar1) {
    local_198 = __gnu_cxx::
                __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
                ::operator*(&__end2);
    if (local_198->type == Info) {
      pRVar3 = ReusableStringStream::operator<<
                         ((ReusableStringStream *)local_108,&local_198->message);
      local_199 = '\n';
      ReusableStringStream::operator<<(pRVar3,&local_199);
    }
    __gnu_cxx::
    __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
    ::operator++(&__end2);
  }
  pRVar3 = ReusableStringStream::operator<<
                     ((ReusableStringStream *)local_108,(char (*) [4])0x2fc925);
  local_1b0 = AssertionResult::getSourceInfo((AssertionResult *)elementName.field_2._8_8_);
  ReusableStringStream::operator<<(pRVar3,&local_1b0);
  ReusableStringStream::str_abi_cxx11_(&local_1e0,(ReusableStringStream *)local_108);
  StringRef::StringRef(&local_1c0,&local_1e0);
  XmlWriter::writeText(&this->xml,local_1c0,Newline);
  std::__cxx11::string::~string((string *)&local_1e0);
  ReusableStringStream::~ReusableStringStream((ReusableStringStream *)local_108);
  ReusableStringStream::~ReusableStringStream((ReusableStringStream *)local_78);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)&messageRss.m_oss);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

void SonarQubeReporter::writeAssertion(AssertionStats const& stats, bool okToFail) {
        AssertionResult const& result = stats.assertionResult;
        if ( !result.isOk() ||
             result.getResultType() == ResultWas::ExplicitSkip ) {
            std::string elementName;
            if (okToFail) {
                elementName = "skipped";
            } else {
                switch (result.getResultType()) {
                case ResultWas::ThrewException:
                case ResultWas::FatalErrorCondition:
                    elementName = "error";
                    break;
                case ResultWas::ExplicitFailure:
                case ResultWas::ExpressionFailed:
                case ResultWas::DidntThrowException:
                    elementName = "failure";
                    break;
                case ResultWas::ExplicitSkip:
                    elementName = "skipped";
                    break;
                    // We should never see these here:
                case ResultWas::Info:
                case ResultWas::Warning:
                case ResultWas::Ok:
                case ResultWas::Unknown:
                case ResultWas::FailureBit:
                case ResultWas::Exception:
                    elementName = "internalError";
                    break;
                }
            }

            XmlWriter::ScopedElement e = xml.scopedElement(elementName);

            ReusableStringStream messageRss;
            messageRss << result.getTestMacroName() << '(' << result.getExpression() << ')';
            xml.writeAttribute("message"_sr, messageRss.str());

            ReusableStringStream textRss;
            if ( result.getResultType() == ResultWas::ExplicitSkip ) {
                textRss << "SKIPPED\n";
            } else {
                textRss << "FAILED:\n";
                if (result.hasExpression()) {
                    textRss << '\t' << result.getExpressionInMacro() << '\n';
                }
                if (result.hasExpandedExpression()) {
                    textRss << "with expansion:\n\t" << result.getExpandedExpression() << '\n';
                }
            }

            if (result.hasMessage())
                textRss << result.getMessage() << '\n';

            for (auto const& msg : stats.infoMessages)
                if (msg.type == ResultWas::Info)
                    textRss << msg.message << '\n';

            textRss << "at " << result.getSourceInfo();
            xml.writeText(textRss.str(), XmlFormatting::Newline);
        }
    }